

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CovergroupBodySymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CovergroupBodySymbol,slang::ast::Compilation&,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  CovergroupBodySymbol *pCVar1;
  size_t in_RDX;
  size_t in_RSI;
  BumpAllocator *in_RDI;
  Compilation *in_stack_000002f0;
  CovergroupBodySymbol *in_stack_000002f8;
  SourceLocation in_stack_00000300;
  
  pCVar1 = (CovergroupBodySymbol *)allocate(in_RDI,in_RSI,in_RDX);
  ast::CovergroupBodySymbol::CovergroupBodySymbol
            (in_stack_000002f8,in_stack_000002f0,in_stack_00000300);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }